

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_slb.c
# Opt level: O2

void * SLB_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint32 PVar1;
  int iVar2;
  void *opaque;
  char *pcVar3;
  void *pvVar4;
  PHYSFS_uint32 PVar5;
  char local_8d;
  PHYSFS_uint32 count;
  PHYSFS_uint32 pos;
  PHYSFS_uint32 tocPos;
  PHYSFS_uint32 version;
  PHYSFS_uint32 size;
  char name_1 [64];
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/carstene1ns[P]physfs-switch/src/physfs_archiver_slb.c"
                  ,0x4d,"void *SLB_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar2 = __PHYSFS_readAll(io,&version,4);
    if (iVar2 == 0) {
      return (void *)0x0;
    }
    version = PHYSFS_swapULE32(version);
    if (version == 0) {
      iVar2 = __PHYSFS_readAll(io,&count,4);
      if (iVar2 == 0) {
        return (void *)0x0;
      }
      count = PHYSFS_swapULE32(count);
      if (count != 0) {
        iVar2 = __PHYSFS_readAll(io,&tocPos,4);
        if (iVar2 == 0) {
          return (void *)0x0;
        }
        tocPos = PHYSFS_swapULE32(tocPos);
        if (tocPos != 0) {
          iVar2 = (*io->seek)(io,(PHYSFS_uint64)tocPos);
          if (iVar2 == 0) {
            return (void *)0x0;
          }
          opaque = UNPK_openArchive(io);
          PVar1 = count;
          PVar5 = 0;
          if (opaque == (void *)0x0) {
            return (void *)0x0;
          }
LAB_001171a4:
          if (PVar5 == PVar1) {
            *claimed = 1;
            return opaque;
          }
          iVar2 = __PHYSFS_readAll(io,&local_8d,1);
          if (iVar2 != 0) {
            if (local_8d == '\\') {
              iVar2 = __PHYSFS_readAll(io,name_1,0x3f);
              if (iVar2 != 0) {
                name_1[0x3f] = '\0';
                pcVar3 = name_1;
                do {
                  if (*pcVar3 == '\\') {
                    *pcVar3 = '/';
                  }
                  else if (*pcVar3 == '\0') goto LAB_00117204;
                  pcVar3 = pcVar3 + 1;
                } while( true );
              }
            }
            else {
              PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
            }
          }
          goto LAB_00117285;
        }
      }
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
LAB_00117204:
  iVar2 = __PHYSFS_readAll(io,&pos,4);
  if (iVar2 == 0) goto LAB_00117285;
  pos = PHYSFS_swapULE32(pos);
  iVar2 = __PHYSFS_readAll(io,&size,4);
  if (iVar2 == 0) goto LAB_00117285;
  size = PHYSFS_swapULE32(size);
  pvVar4 = UNPK_addEntry(opaque,name_1,0,-1,-1,(ulong)pos,(ulong)size);
  PVar5 = PVar5 + 1;
  if (pvVar4 == (void *)0x0) {
LAB_00117285:
    UNPK_abandonArchive(opaque);
    return (void *)0x0;
  }
  goto LAB_001171a4;
}

Assistant:

static void *SLB_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint32 version;
    PHYSFS_uint32 count;
    PHYSFS_uint32 tocPos;
    void *unpkarc;

    /* There's no identifier on an SLB file, so we assume it's _not_ if the
       file count or tocPos is zero. Beyond that, we'll assume it's
       bogus/corrupt if the entries' filenames don't start with '\' or the
       tocPos is past the end of the file (seek will fail). This probably
       covers all meaningful cases where we would accidentally accept a non-SLB
       file with this archiver. */

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &version, sizeof (version)), NULL);
    version = PHYSFS_swapULE32(version);
    BAIL_IF(version != 0, PHYSFS_ERR_UNSUPPORTED, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof (count)), NULL);
    count = PHYSFS_swapULE32(count);
    BAIL_IF(!count, PHYSFS_ERR_UNSUPPORTED, NULL);

    /* offset of the table of contents */
    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &tocPos, sizeof (tocPos)), NULL);
    tocPos = PHYSFS_swapULE32(tocPos);
    BAIL_IF(!tocPos, PHYSFS_ERR_UNSUPPORTED, NULL);
    
    /* seek to the table of contents */
    BAIL_IF_ERRPASS(!io->seek(io, tocPos), NULL);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!slbLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    *claimed = 1;  /* oh well. */

    return unpkarc;
}